

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void build_cpush_cinv(m68k_info *info,int op_offset)

{
  cs_m68k *pcVar1;
  anon_union_8_5_85a7a27f_for_cs_m68k_op_0 aVar2;
  anon_union_8_5_85a7a27f_for_cs_m68k_op_0 aVar3;
  uint in_ESI;
  long in_RDI;
  cs_m68k *ext;
  cs_m68k_op *op1;
  cs_m68k_op *op0;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  m68k_info *in_stack_ffffffffffffffe0;
  
  pcVar1 = build_init_op(in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                         (int)in_stack_ffffffffffffffd8,
                         (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  switch(*(uint *)(in_RDI + 0x24) >> 3 & 3) {
  case 0:
    d68000_invalid((m68k_info *)0x3a3b1e);
    return;
  case 1:
    MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),in_ESI);
    break;
  case 2:
    MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),in_ESI + 1);
    break;
  case 3:
    pcVar1->op_count = '\x01';
    MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),in_ESI + 2);
  }
  pcVar1->operands[0].address_mode = M68K_AM_IMMEDIATE;
  pcVar1->operands[0].type = M68K_OP_IMM;
  aVar2.reg_pair.reg_1 = 0;
  aVar2.reg = *(uint *)(in_RDI + 0x24) >> 6 & 3;
  pcVar1->operands[0].field_0 = aVar2;
  pcVar1->operands[1].type = M68K_OP_MEM;
  pcVar1->operands[1].address_mode = M68K_AM_REG_DIRECT_ADDR;
  aVar3.reg_pair.reg_1 = 0;
  aVar3.reg = (*(uint *)(in_RDI + 0x24) & 7) + 9;
  pcVar1->operands[1].field_0 = aVar3;
  return;
}

Assistant:

static void build_cpush_cinv(m68k_info *info, int op_offset)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, M68K_INS_INVALID, 2, 0);

	switch ((info->ir >> 3) & 3) { // scope
		// Invalid
		case 0:
			d68000_invalid(info);
			return;
			// Line
		case 1:
			MCInst_setOpcode(info->inst, op_offset + 0);
			break;
			// Page
		case 2:
			MCInst_setOpcode(info->inst, op_offset + 1);
			break;
			// All
		case 3:
			ext->op_count = 1;
			MCInst_setOpcode(info->inst, op_offset + 2);
			break;
	}

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->address_mode = M68K_AM_IMMEDIATE;
	op0->type = M68K_OP_IMM;
	op0->imm = (info->ir >> 6) & 3;

	op1->type = M68K_OP_MEM;
	op1->address_mode = M68K_AM_REG_DIRECT_ADDR;
	op1->imm = M68K_REG_A0 + (info->ir & 7);
}